

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sph.cpp
# Opt level: O2

KHType __thiscall
Pearson8x8::operator()
          (Pearson8x8 *this,string *keyword,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *mixTable,size_t pkSize)

{
  KeyHash<unsigned_char,_unsigned_char> KVar1;
  KHType KVar2;
  code *local_28 [2];
  code *local_18;
  code *local_10;
  
  local_28[1] = (code *)0x0;
  local_28[0] = hash;
  local_10 = std::
             _Function_handler<unsigned_char_(const_char_*,_const_unsigned_char_*,_unsigned_long),_unsigned_char_(*)(const_char_*,_const_unsigned_char_*,_unsigned_long)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<unsigned_char_(const_char_*,_const_unsigned_char_*,_unsigned_long),_unsigned_char_(*)(const_char_*,_const_unsigned_char_*,_unsigned_long)>
             ::_M_manager;
  KVar1 = HashInfix<unsigned_char,unsigned_char>
                    (keyword,mixTable,pkSize,
                     (function<unsigned_char_(const_char_*,_const_unsigned_char_*,_unsigned_long)> *
                     )local_28);
  std::_Function_base::~_Function_base((_Function_base *)local_28);
  KVar2.key = KVar1.key;
  KVar2.hash = KVar1.hash;
  return KVar2;
}

Assistant:

KHType operator()(const string & keyword, const vector<Key> & mixTable, const size_t pkSize)
    {
        return HashInfix<Key, Hash>(keyword, mixTable, pkSize, hash);
    }